

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

size_t GetUTF8Length(char firstbyte)

{
  char firstbyte_local;
  undefined8 local_8;
  
  if (((int)firstbyte & 0x80U) == 0) {
    local_8 = 1;
  }
  else if (((int)firstbyte & 0xe0U) == 0xc0) {
    local_8 = 2;
  }
  else if (((int)firstbyte & 0xf0U) == 0xe0) {
    local_8 = 3;
  }
  else if (((int)firstbyte & 0xf8U) == 0xf0) {
    local_8 = 4;
  }
  else if (((int)firstbyte & 0xfcU) == 0xf8) {
    local_8 = 5;
  }
  else if (((int)firstbyte & 0xfeU) == 0xfc) {
    local_8 = 6;
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

size_t GetUTF8Length(char firstbyte)
{
	if ((firstbyte & 0x80) == 0x00)
	{
		return 1;
	}
	else if ((firstbyte & 0xe0) == 0xc0)
	{
		return 2;
	}
	else if ((firstbyte & 0xf0) == 0xe0)
	{
		return 3;
	}
	else if ((firstbyte & 0xf8) == 0xf0)
	{
		return 4;
	}
	else if ((firstbyte & 0xfc) == 0xf8)
	{
		return 5;
	}
	else if ((firstbyte & 0xfe) == 0xfc)
	{
		return 6;
	}
	return 0;
}